

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

void __thiscall Refal2::CArbitraryInteger::Add(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  pointer puVar2;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar2 && (puVar2 = puVar2 + -1, *puVar2 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  puVar1 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar2 && (puVar2 = puVar2 + -1, *puVar2 == 0))) {
    (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  if (this->isNegative == operand->isNegative) {
    add(this,operand);
  }
  else {
    sub(this,operand);
  }
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar2 && (puVar2 = puVar2 + -1, *puVar2 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  return;
}

Assistant:

void CArbitraryInteger::Add( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		// result sign will be the same of operands
		add( operand );
	} else {
		sub( operand );
	}
	removeLeadingZeros();
}